

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CouchDBInterface.cc
# Opt level: O1

bool __thiscall CouchDBInterface::sendDocument(CouchDBInterface *this,JSONObject *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *__s;
  long *plVar4;
  undefined8 uVar5;
  size_t sVar6;
  mapped_type *this_00;
  long *plVar7;
  size_type *psVar8;
  char *response;
  string url;
  size_t response_size;
  string towritestring;
  string local_120;
  char *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  JSON::JSONObject::toString_abi_cxx11_(&local_50,object,0);
  local_100 = (char *)0x0;
  local_78 = 0;
  __stream = open_memstream(&local_100,&local_78);
  __s = (char *)operator_new__(0x100);
  curl_easy_setopt(this->handle,0x2f,1);
  std::operator+(&local_70,"http://",&this->server);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d8 = &local_c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c8 = *plVar7;
    lStack_c0 = plVar4[3];
  }
  else {
    local_c8 = *plVar7;
    local_d8 = (long *)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d8,(ulong)(this->port)._M_dataplus._M_p);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a8 = *plVar7;
    lStack_a0 = plVar4[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar7;
    local_b8 = (long *)*plVar4;
  }
  local_b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_88 = *plVar7;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar7;
    local_98 = (long *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)(this->databasename)._M_dataplus._M_p);
  paVar1 = &local_120.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_120.field_2._M_allocated_capacity = *psVar8;
    local_120.field_2._8_8_ = plVar4[3];
    local_120._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar8;
    local_120._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_120._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_f8 = &local_e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_e8 = *plVar7;
    lStack_e0 = plVar4[3];
  }
  else {
    local_e8 = *plVar7;
    local_f8 = (long *)*plVar4;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  curl_easy_setopt(this->handle,0x2712,local_f8);
  curl_easy_setopt(this->handle,0x271f,local_50._M_dataplus._M_p);
  curl_easy_setopt(this->handle,0x2711,__stream);
  uVar5 = curl_slist_append(0,"Content-Type: application/json");
  curl_easy_setopt(this->handle,0x2727,uVar5);
  curl_easy_setopt(this->handle,0x271a,__s);
  iVar3 = curl_easy_perform(this->handle);
  fclose(__stream);
  curl_slist_free_all(uVar5);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->last_curl_error,0,(char *)(this->last_curl_error)._M_string_length,
               0x10f349);
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,local_100,local_100 + local_78);
    JSON::JSONObject::fromString(&this->last_couch_result,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"ok","");
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
              ::operator[](&(this->last_couch_result).
                            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                           ,&local_120);
    bVar2 = JSON::JSONValue::isBoolTrue(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_120._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,__s,__s + sVar6);
    std::__cxx11::string::operator=((string *)&this->last_curl_error,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  operator_delete(__s,1);
  free(local_100);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (bool)(iVar3 == 0 & bVar2);
}

Assistant:

bool CouchDBInterface::sendDocument(const JSONObject &object) {
	//here is what we want to send to couchdb
	string towritestring=object.toString();
	//here is space to store the response from the db
	char *response=NULL;
	size_t response_size=0;
    FILE *responseptr=open_memstream(&response,&response_size);
	//here is space to put curl error messages in
	char *errbuf=new char[CURL_ERROR_SIZE];
	//set up the curl options
	curl_easy_setopt(handle,CURLOPT_POST,1L);
	string url="http://"+server+":"+port+"/"+databasename+"/";
	curl_easy_setopt(handle,CURLOPT_URL,url.c_str());
	curl_easy_setopt(handle,CURLOPT_POSTFIELDS,towritestring.c_str());
	curl_easy_setopt(handle,CURLOPT_WRITEDATA,responseptr);
	struct curl_slist *slist=curl_slist_append(NULL, "Content-Type: application/json");
	curl_easy_setopt(handle,CURLOPT_HTTPHEADER,slist);
	curl_easy_setopt(handle,CURLOPT_ERRORBUFFER,errbuf);
	//perform the operation
	CURLcode result=curl_easy_perform(handle);
	//cleanup
    fclose(responseptr); //this has to be done to access the buffer
	curl_slist_free_all(slist);
	//check for curl error
	bool couchok=false;
	if(result!=CURLE_OK) {
		last_curl_error=string(errbuf);
	} else {
		last_curl_error="";
		last_couch_result.fromString(string(response,response_size));
		if(last_couch_result["ok"].isBoolTrue()) couchok=true; 
	}
	delete errbuf;
	//check for couchdb error
	free(response);
	return (result==0)&&couchok;
}